

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetTempPathA(DWORD nBufferLength,LPSTR lpBuffer)

{
  DWORD DVar1;
  size_t sVar2;
  int defaultDirLen;
  char *defaultDir;
  DWORD dwPathLen;
  LPSTR lpBuffer_local;
  DWORD nBufferLength_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (lpBuffer == (LPSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpBuffer_local._4_4_ = 0;
  }
  else {
    DVar1 = GetEnvironmentVariableA("TMPDIR",lpBuffer,nBufferLength);
    if (DVar1 == 0) {
      sVar2 = strlen("/tmp/");
      defaultDir._4_4_ = (uint)sVar2;
      if (defaultDir._4_4_ < nBufferLength) {
        strcpy_s(lpBuffer,(ulong)nBufferLength,"/tmp/");
      }
      else {
        defaultDir._4_4_ = defaultDir._4_4_ + 1;
      }
    }
    else if (DVar1 < nBufferLength) {
      defaultDir._4_4_ = DVar1;
      if (lpBuffer[DVar1 - 1] != '/') {
        if (nBufferLength < DVar1 + 2) {
          defaultDir._4_4_ = DVar1 + 2;
        }
        else {
          defaultDir._4_4_ = DVar1 + 1;
          lpBuffer[DVar1] = '/';
          lpBuffer[defaultDir._4_4_] = '\0';
        }
      }
    }
    else {
      defaultDir._4_4_ = DVar1 + 1;
    }
    if (nBufferLength <= defaultDir._4_4_) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x7a);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    lpBuffer_local._4_4_ = defaultDir._4_4_;
  }
  return lpBuffer_local._4_4_;
}

Assistant:

DWORD
PALAPI
GetTempPathA(
	     IN DWORD nBufferLength,
	     OUT LPSTR lpBuffer)
{
    DWORD dwPathLen = 0;

    PERF_ENTRY(GetTempPathA);
    ENTRY("GetTempPathA(nBufferLength=%u, lpBuffer=%p)\n",
          nBufferLength, lpBuffer);

    if ( !lpBuffer )
    {
        ERROR( "lpBuffer was not a valid pointer.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
        LOGEXIT("GetTempPathA returns DWORD %u\n", dwPathLen);
        PERF_EXIT(GetTempPathA);
        return 0;
    }

    /* Try the TMPDIR environment variable. This is the same env var checked by mktemp. */
    dwPathLen = GetEnvironmentVariableA("TMPDIR", lpBuffer, nBufferLength);
    if (dwPathLen > 0)
    {
        /* The env var existed. dwPathLen will be the length without null termination
         * if the entire value was successfully retrieved, or it'll be the length
         * required to store the value with null termination.
         */
        if (dwPathLen < nBufferLength)
        {
            /* The environment variable fit in the buffer. Make sure it ends with '/'. */
            if (lpBuffer[dwPathLen - 1] != '/')
            {
                /* If adding the slash would still fit in our provided buffer, do it.  Otherwise,
                 * let the caller know how much space would be needed.
                 */
                if (dwPathLen + 2 <= nBufferLength)
                {
                    lpBuffer[dwPathLen++] = '/';
                    lpBuffer[dwPathLen] = '\0';
                }
                else
                {
                    dwPathLen += 2;
                }
            }
        }
        else /* dwPathLen >= nBufferLength */
        {
            /* The value is too long for the supplied buffer.  dwPathLen will now be the
             * length required to hold the value, but we don't know whether that value
             * is going to be '/' terminated.  Since we'll need enough space for the '/', and since
             * a caller would assume that the dwPathLen we return will be sufficient,
             * we make sure to account for it in dwPathLen even if that means we end up saying
             * one more byte of space is needed than actually is.
             */
            dwPathLen++;
        }
    }
    else /* env var not found or was empty */
    {
        /* no luck, use /tmp/ */
        const char *defaultDir = "/tmp/";
        int defaultDirLen = strlen(defaultDir);
        if (defaultDirLen < nBufferLength)
        {
            dwPathLen = defaultDirLen;
            strcpy_s(lpBuffer, nBufferLength, defaultDir);
        }
        else
        {
            /* get the required length */
            dwPathLen = defaultDirLen + 1;
        }
    }

    if ( dwPathLen >= nBufferLength )
    {
        ERROR("Buffer is too small, need space for %d characters including null termination\n", dwPathLen);
        SetLastError( ERROR_INSUFFICIENT_BUFFER );
    }

    LOGEXIT("GetTempPathA returns DWORD %u\n", dwPathLen);
    PERF_EXIT(GetTempPathA);
    return dwPathLen;
}